

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O0

MPP_RET mpp_opt_deinit(MppOpt opt)

{
  MppOptImpl *impl;
  MppOpt opt_local;
  
  if (opt == (MppOpt)0x0) {
    opt_local._4_4_ = MPP_NOK;
  }
  else {
    if (*(long *)((long)opt + 8) != 0) {
      mpp_trie_deinit(*(undefined8 *)((long)opt + 8));
      *(undefined8 *)((long)opt + 8) = 0;
    }
    if (opt != (MppOpt)0x0) {
      mpp_osal_free("mpp_opt_deinit",opt);
    }
    opt_local._4_4_ = MPP_OK;
  }
  return opt_local._4_4_;
}

Assistant:

MPP_RET mpp_opt_deinit(MppOpt opt)
{
    MppOptImpl *impl = (MppOptImpl *)opt;

    if (NULL == impl)
        return MPP_NOK;

    if (impl->trie) {
        mpp_trie_deinit(impl->trie);
        impl->trie = NULL;
    }
    MPP_FREE(impl);

    return MPP_OK;
}